

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh8_factory.cpp
# Opt level: O1

Accel * __thiscall
embree::BVH8Factory::BVH8Quad4iMB
          (BVH8Factory *this,Scene *scene,BuildVariant bvariant,IntersectVariant ivariant)

{
  long lVar1;
  int iVar2;
  BVH8 *bvh;
  Builder *pBVar3;
  Accel *pAVar4;
  undefined8 *puVar5;
  long *plVar6;
  long *plVar7;
  Intersectors intersectors;
  long *local_180;
  long local_170;
  undefined4 uStack_168;
  undefined4 uStack_164;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  Intersectors local_140;
  
  bvh = (BVH8 *)alignedMalloc(0x240,0x10);
  BVHN<8>::BVHN((BVHN<8> *)bvh,(PrimitiveType *)&QuadMi<4>::type,scene);
  BVH8Quad4iMBIntersectors(&local_140,this,bvh,ivariant);
  iVar2 = std::__cxx11::string::compare
                    ((char *)(*(long *)&(scene->super_AccelN).field_0x188 + 0x150));
  if (iVar2 == 0) {
    if (bvariant == STATIC) {
      pBVar3 = (*this->BVH8Quad4iMBSceneBuilderSAH)(bvh,scene,0);
    }
    else {
      pBVar3 = (Builder *)0x0;
    }
    pAVar4 = (Accel *)alignedMalloc(0x180,0x10);
    (pAVar4->super_AccelData).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
    *(undefined8 *)&(pAVar4->super_AccelData).bounds.bounds0.lower.field_0 = 0x7f8000007f800000;
    *(undefined8 *)((long)&(pAVar4->super_AccelData).bounds.bounds0.lower.field_0 + 8) =
         0x7f8000007f800000;
    *(undefined8 *)&(pAVar4->super_AccelData).bounds.bounds0.upper.field_0 = 0xff800000ff800000;
    *(undefined8 *)((long)&(pAVar4->super_AccelData).bounds.bounds0.upper.field_0 + 8) =
         0xff800000ff800000;
    *(undefined8 *)&(pAVar4->super_AccelData).bounds.bounds1.lower.field_0 = 0x7f8000007f800000;
    *(undefined8 *)((long)&(pAVar4->super_AccelData).bounds.bounds1.lower.field_0 + 8) =
         0x7f8000007f800000;
    *(undefined8 *)&(pAVar4->super_AccelData).bounds.bounds1.upper.field_0 = 0xff800000ff800000;
    *(undefined8 *)((long)&(pAVar4->super_AccelData).bounds.bounds1.upper.field_0 + 8) =
         0xff800000ff800000;
    (pAVar4->super_AccelData).type = TY_ACCEL_INSTANCE;
    (pAVar4->super_AccelData).super_RefCount._vptr_RefCount = (_func_int **)&PTR__RefCount_02207ae8;
    memcpy(&(pAVar4->super_AccelData).field_0x58,&local_140,0x118);
    (pAVar4->super_AccelData).super_RefCount._vptr_RefCount =
         (_func_int **)&PTR__AccelInstance_02207a80;
    pAVar4[1].super_AccelData.super_RefCount._vptr_RefCount = (_func_int **)bvh;
    pAVar4[1].super_AccelData.super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i =
         (__int_type_conflict)pBVar3;
    return pAVar4;
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(0x30);
  std::operator+(&local_160,"unknown builder ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (*(long *)&(scene->super_AccelN).field_0x188 + 0x150));
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_160);
  local_180 = (long *)*plVar6;
  plVar7 = plVar6 + 2;
  if (local_180 == plVar7) {
    local_170 = *plVar7;
    uStack_168 = (undefined4)plVar6[3];
    uStack_164 = *(undefined4 *)((long)plVar6 + 0x1c);
    local_180 = &local_170;
  }
  else {
    local_170 = *plVar7;
  }
  lVar1 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  *puVar5 = &PTR__rtcore_error_022018b0;
  *(undefined4 *)(puVar5 + 1) = 2;
  puVar5[2] = puVar5 + 4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar5 + 2),local_180,lVar1 + (long)local_180);
  __cxa_throw(puVar5,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
}

Assistant:

Accel* BVH8Factory::BVH8Quad4iMB(Scene* scene, BuildVariant bvariant, IntersectVariant ivariant)
  {
    BVH8* accel = new BVH8(Quad4i::type,scene);
    Accel::Intersectors intersectors = BVH8Quad4iMBIntersectors(accel,ivariant);

    Builder* builder = nullptr;
    if (scene->device->quad_builder_mb == "default") {
      switch (bvariant) {
      case BuildVariant::STATIC      : builder = BVH8Quad4iMBSceneBuilderSAH(accel,scene,0); break;
      case BuildVariant::DYNAMIC     : assert(false); break; // FIXME: implement
      case BuildVariant::HIGH_QUALITY: assert(false); break;
      }
    }
    else throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"unknown builder "+scene->device->quad_builder_mb+" for BVH8<Quad4i>");

    return new AccelInstance(accel,builder,intersectors);
  }